

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

void __thiscall
CheckFailure::CheckFailure
          (CheckFailure *this,UtestShell *test,char *fileName,int lineNumber,
          SimpleString *checkString,SimpleString *conditionString,SimpleString *text)

{
  undefined8 in_RDX;
  char *in_RSI;
  UtestShell *in_RDI;
  TestFailure *in_R8;
  SimpleString *in_R9;
  TestFailure *unaff_retaddr;
  SimpleString *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffc8;
  
  TestFailure::TestFailure(unaff_retaddr,in_RDI,in_RSI,(int)((ulong)in_RDX >> 0x20));
  in_RDI->_vptr_UtestShell = (_func_int **)&PTR__CheckFailure_0025da90;
  TestFailure::createUserText(in_R8,in_R9);
  SimpleString::operator=((SimpleString *)in_RDI,in_stack_ffffffffffffffa8);
  SimpleString::~SimpleString((SimpleString *)0x211162);
  SimpleString::operator+=((SimpleString *)in_RDI,in_stack_ffffffffffffffa8);
  SimpleString::operator+=(in_R9,in_stack_ffffffffffffffc8);
  SimpleString::operator+=((SimpleString *)in_RDI,in_stack_ffffffffffffffa8);
  SimpleString::operator+=(in_R9,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

CheckFailure::CheckFailure(UtestShell* test, const char* fileName, int lineNumber, const SimpleString& checkString, const SimpleString& conditionString, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    message_ += checkString;
    message_ += "(";
    message_ += conditionString;
    message_ += ") failed";
}